

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

void __thiscall
Random_keys::mutacaoAdaptavitva(Random_keys *this,RK_Individual *ind,float pctTam,float pctChance)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  int local_30;
  int j;
  int i;
  int m;
  int n;
  int tam;
  float pctChance_local;
  float pctTam_local;
  RK_Individual *ind_local;
  Random_keys *this_local;
  
  iVar1 = RK_Individual::getNumEdges(ind);
  dVar3 = std::round((double)(ulong)(uint)(pctTam * (float)iVar1));
  dVar4 = std::round((double)(ulong)(uint)(pctChance * 100.0));
  iVar1 = rand();
  if (iVar1 % 100 <= (int)SUB84(dVar4,0)) {
    for (local_30 = 0; local_30 < (int)SUB84(dVar3,0); local_30 = local_30 + 1) {
      rand();
      RK_Individual::getNumEdges(ind);
      iVar1 = rand();
      pdVar2 = RK_Individual::getWeights(ind);
      pdVar2[local_30] = (double)(iVar1 % 100);
    }
  }
  return;
}

Assistant:

void Random_keys::mutacaoAdaptavitva(RK_Individual *ind, float pctTam, float pctChance) {

    int tam = round(pctTam* ind->getNumEdges());
    int n = round(pctChance*100);
    int m = rand() % 100;

    if(m<=n){
        for(int i=0; i<tam; i++){
            int j = rand() % ind->getNumEdges();

            ind->getWeights()[i] = rand() % RANGEPESO;
        }
    }
}